

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_nco_rule.cpp
# Opt level: O0

void r8vec_linspace2(int n,double a_first,double a_last,double *a)

{
  int local_2c;
  int i;
  double *a_local;
  double a_last_local;
  double a_first_local;
  int n_local;
  
  if (n == 1) {
    *a = (a_first + a_last) / 2.0;
  }
  else {
    for (local_2c = 0; local_2c < n; local_2c = local_2c + 1) {
      a[local_2c] = ((double)(n - local_2c) * a_first + (double)(local_2c + 1) * a_last) /
                    (double)(n + 1);
    }
  }
  return;
}

Assistant:

void r8vec_linspace2 ( int n, double a_first, double a_last, double a[] )

//****************************************************************************80
//
//  Purpose:
//
//    R8VEC_LINSPACE creates a vector of linearly spaced values.
//
//  Discussion:
//
//    An R8VEC is a vector of R8's.
//
//    4 points evenly spaced between 0 and 12 will yield 2, 4, 6, 8, 10.
//
//    In other words, the interval is divided into N+1 even subintervals,
//    and the endpoints of internal intervals are used as the points.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 September 2012
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, double A_FIRST, A_LAST, the first and last entries.
//
//    Output, double A[N], a vector of linearly spaced data.
//
{
  int i;

  if ( n == 1 )
  {
    a[0] = ( a_first + a_last ) / 2.0;
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      a[i] = ( double( n - i     ) * a_first 
             + double(     i + 1 ) * a_last ) 
             / double( n     + 1 );
    }
  }
  return;
}